

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O2

void overlap_remove(bam_plp_t iter,bam1_t *b)

{
  khint_t x;
  kh_olap_hash_t *h;
  uint x_00;
  byte bVar1;
  
  h = iter->overlaps;
  if (h != (kh_olap_hash_t *)0x0) {
    if (b == (bam1_t *)0x0) {
      bVar1 = 0;
      for (x_00 = 0; x_00 < h->n_buckets; x_00 = x_00 + 1) {
        if ((h->flags[x_00 >> 4] >> (bVar1 & 0x1e) & 3) == 0) {
          kh_del_olap_hash(h,x_00);
          h = iter->overlaps;
        }
        bVar1 = bVar1 + 2;
      }
    }
    else {
      x = kh_get_olap_hash(h,(kh_cstr_t)b->data);
      if (x != h->n_buckets) {
        kh_del_olap_hash(h,x);
        return;
      }
    }
  }
  return;
}

Assistant:

static void overlap_remove(bam_plp_t iter, const bam1_t *b)
{
    if ( !iter->overlaps ) return;

    khiter_t kitr;
    if ( b )
    {
        kitr = kh_get(olap_hash, iter->overlaps, bam_get_qname(b));
        if ( kitr!=kh_end(iter->overlaps) )
            kh_del(olap_hash, iter->overlaps, kitr);
    }
    else
    {
        // remove all
        for (kitr = kh_begin(iter->overlaps); kitr<kh_end(iter->overlaps); kitr++)
            if ( kh_exist(iter->overlaps, kitr) ) kh_del(olap_hash, iter->overlaps, kitr);
    }
}